

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareCoordinates_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case)

{
  size_t sVar1;
  TestError *this_00;
  ulong uVar2;
  undefined *puVar3;
  long lVar4;
  size_t position;
  size_t local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  long local_40;
  long *local_38;
  
  sVar1 = test_case->m_texture_access_index;
  lVar4 = test_case->m_source_texture_target_index * 0x30;
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"TYPE(VAL_LIST)","");
  uVar2 = (*(long *)(texture_targets + lVar4 + 8) +
          *(long *)(texture_targets + lVar4) + *(long *)(texture_access + sVar1 * 0x18 + 8)) - 1;
  if (texture_access[sVar1 * 0x18 + 0x11] == '\0') {
    if (3 < uVar2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xc9d);
      goto LAB_008658ed;
    }
    puVar3 = &DAT_02111a68;
  }
  else {
    if (3 < uVar2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xcb2);
LAB_008658ed:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    puVar3 = &DAT_02111a88;
  }
  local_50 = 0;
  Utils::replaceToken("TYPE",&local_50,
                      *(GLchar **)
                       (puVar3 + (*(long *)(texture_targets + lVar4) +
                                  *(long *)(texture_access + sVar1 * 0x18 + 8) +
                                 *(long *)(texture_targets + lVar4 + 8)) * 8 + -8),
                      __return_storage_ptr__);
  local_38 = (long *)(texture_targets + lVar4);
  lVar4 = *(long *)(texture_targets + lVar4 + 8);
  local_40 = sVar1 * 3;
  if (lVar4 != 0) {
    do {
      sVar1 = local_50;
      Utils::replaceToken("VAL_LIST",&local_50,"0, VAL_LIST",__return_storage_ptr__);
      local_50 = sVar1 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  lVar4 = *local_38;
  if (lVar4 != 0) {
    do {
      sVar1 = local_50;
      Utils::replaceToken("VAL_LIST",&local_50,"0, VAL_LIST",__return_storage_ptr__);
      local_50 = sVar1 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  lVar4 = *(long *)(texture_access + local_40 * 8 + 8);
  if (lVar4 != 0) {
    do {
      sVar1 = local_50;
      Utils::replaceToken("VAL_LIST",&local_50,"1, VAL_LIST",__return_storage_ptr__);
      local_50 = sVar1 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  Utils::replaceToken(", VAL_LIST",&local_50,"",__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SmokeTest::prepareCoordinates(const testCase& test_case)
{
	const _texture_access& access = texture_access[test_case.m_texture_access_index];
	const _texture_target& target = texture_targets[test_case.m_source_texture_target_index];

	const glw::GLchar* type = 0;

	std::string coordinates = "TYPE(VAL_LIST)";

	if (false == access.m_use_integral_coordinates)
	{
		switch (access.m_n_coordinates + target.m_n_array_coordinates + target.m_n_coordinates)
		{
		case 1:
			type = "float";
			break;
		case 2:
			type = "vec2";
			break;
		case 3:
			type = "vec3";
			break;
		case 4:
			type = "vec4";
			break;
		default:
			TCU_FAIL("Invalid value");
			break;
		}
	}
	else
	{
		switch (access.m_n_coordinates + target.m_n_array_coordinates + target.m_n_coordinates)
		{
		case 1:
			type = "int";
			break;
		case 2:
			type = "ivec2";
			break;
		case 3:
			type = "ivec3";
			break;
		case 4:
			type = "ivec4";
			break;
		default:
			TCU_FAIL("Invalid value");
			break;
		}
	}

	size_t position = 0;

	Utils::replaceToken("TYPE", position, type, coordinates);

	for (size_t i = 0; i < target.m_n_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "0, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	for (size_t i = 0; i < target.m_n_array_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "0, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	for (size_t i = 0; i < access.m_n_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "1, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	Utils::replaceToken(", VAL_LIST", position, "", coordinates);

	return coordinates;
}